

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O0

void __thiscall Am_String_Data::Print(Am_String_Data *this,ostream *out)

{
  ostream *out_local;
  Am_String_Data *this_local;
  
  std::operator<<(out,this->value);
  return;
}

Assistant:

void
Am_String_Data::Print(std::ostream &out) const
{
  out << value;
}